

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

pcp_flow_t *
pcp_new_flow(pcp_ctx_t *ctx,sockaddr *src_addr,sockaddr *dst_addr,sockaddr *ext_addr,
            uint8_t protocol,uint32_t lifetime,void *userdata)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pcp_errno pVar4;
  bool bVar5;
  sockaddr_in6 *te6;
  sockaddr_in *te4;
  in6_addr *__a_3;
  in6_addr *__a_2;
  in6_addr *__a_1;
  in6_addr *__a;
  sockaddr_storage tmp_ext_addr;
  caasi_data data;
  undefined1 local_80 [4];
  flow_key_data kd;
  uint32_t lifetime_local;
  uint8_t protocol_local;
  sockaddr *ext_addr_local;
  sockaddr *dst_addr_local;
  sockaddr *src_addr_local;
  pcp_ctx_t *ctx_local;
  
  kd.field_5._16_4_ = lifetime;
  kd.field_5._23_1_ = protocol;
  memset((void *)((long)&data.userdata + 4),0,0x4c);
  if ((src_addr == (sockaddr *)0x0) || (ctx == (pcp_ctx_t *)0x0)) {
    return (pcp_flow_t *)0x0;
  }
  pcp_fill_in6_addr((in6_addr *)local_80,(uint16_t *)((long)kd.nonce.n + 6),
                    kd.pcp_server_ip.__in6_u.__u6_addr32 + 2,src_addr);
  kd.nonce.n[1]._0_1_ = kd.field_5._23_1_;
  ext_addr_local = dst_addr;
  if (dst_addr != (sockaddr *)0x0) {
    if (dst_addr->sa_family == 2) {
      if (*(int *)(dst_addr->sa_data + 2) == 0) {
        ext_addr_local = (sockaddr *)0x0;
      }
    }
    else if (dst_addr->sa_family == 10) {
      bVar5 = false;
      if (((*(int *)(dst_addr->sa_data + 6) == 0) &&
          (bVar5 = false, *(int *)(dst_addr->sa_data + 10) == 0)) &&
         (iVar1._0_2_ = dst_addr[1].sa_family, iVar1._2_1_ = dst_addr[1].sa_data[0],
         iVar1._3_1_ = dst_addr[1].sa_data[1], bVar5 = false, iVar1 == 0)) {
        bVar5 = *(int *)(dst_addr[1].sa_data + 2) == 0;
      }
      if (!bVar5) {
        bVar5 = false;
        if ((*(int *)(dst_addr->sa_data + 6) == 0) &&
           (bVar5 = false, *(int *)(dst_addr->sa_data + 10) == 0)) {
          uVar3._0_2_ = dst_addr[1].sa_family;
          uVar3._2_1_ = dst_addr[1].sa_data[0];
          uVar3._3_1_ = dst_addr[1].sa_data[1];
          uVar2 = htonl(0xffff);
          bVar5 = uVar3 == uVar2;
        }
        if (((!bVar5) || (dst_addr[1].sa_data[2] != '\0')) ||
           ((dst_addr[1].sa_data[3] != '\0' ||
            ((dst_addr[1].sa_data[4] != '\0' || (dst_addr[1].sa_data[5] != '\0'))))))
        goto LAB_0010309b;
      }
      ext_addr_local = (sockaddr *)0x0;
    }
    else {
      ext_addr_local = (sockaddr *)0x0;
    }
  }
LAB_0010309b:
  if (ext_addr_local == (sockaddr *)0x0) {
    data.userdata._4_1_ = 1;
  }
  else {
    pcp_fill_in6_addr((in6_addr *)(kd.nonce.n + 2),(uint16_t *)((long)&kd.field_5 + 0xc),
                      (uint32_t *)0x0,ext_addr_local);
    data.userdata._4_1_ = 2;
    if (src_addr->sa_family == 2) {
      if (kd.src_ip.__in6_u.__u6_addr32[1] == 0) {
        findsaddr((sockaddr_in *)ext_addr_local,(in6_addr *)local_80);
      }
    }
    else {
      bVar5 = false;
      if (((local_80 == (undefined1  [4])0x0) && (bVar5 = false, kd._0_4_ == 0)) &&
         (bVar5 = false, kd.src_ip.__in6_u.__u6_addr32[0] == 0)) {
        bVar5 = kd.src_ip.__in6_u.__u6_addr32[1] == 0;
      }
      if (!bVar5) {
        bVar5 = false;
        if ((local_80 == (undefined1  [4])0x0) && (bVar5 = false, kd._0_4_ == 0)) {
          uVar3 = htonl(0xffff);
          bVar5 = kd.src_ip.__in6_u.__u6_addr32[0] == uVar3;
        }
        if (((!bVar5) || (kd.src_ip.__in6_u.__u6_addr8[4] != '\0')) ||
           ((kd.src_ip.__in6_u.__u6_addr8[5] != '\0' ||
            ((kd.src_ip.__in6_u.__u6_addr8[6] != '\0' || (kd.src_ip.__in6_u.__u6_addr8[7] != '\0')))
            ))) {
          if (ext_addr_local->sa_family != src_addr->sa_family) {
            return (pcp_flow_t *)0x0;
          }
          goto LAB_0010325d;
        }
      }
      findsaddr6((sockaddr_in6 *)ext_addr_local,(in6_addr *)local_80,
                 kd.pcp_server_ip.__in6_u.__u6_addr32 + 2);
    }
  }
LAB_0010325d:
  _lifetime_local = ext_addr;
  if (ext_addr == (sockaddr *)0x0) {
    __a._0_2_ = src_addr->sa_family;
    if ((sa_family_t)__a == 2) {
      memset((void *)((long)&__a + 4),0,4);
    }
    else {
      if ((sa_family_t)__a != 10) {
        return (pcp_flow_t *)0x0;
      }
      memset(&tmp_ext_addr,0,0x10);
    }
    __a._2_2_ = 0;
    _lifetime_local = (sockaddr *)&__a;
  }
  data.kd = (flow_key_data *)0x0;
  data.ffirst._0_4_ = kd.field_5._16_4_;
  data._24_8_ = _lifetime_local;
  tmp_ext_addr.__ss_align = (long)&data.userdata + 4;
  data.fprev = (pcp_flow_t *)0x0;
  data.app_name = (char *)userdata;
  pVar4 = pcp_db_foreach_server(ctx,chain_and_assign_src_ip,&tmp_ext_addr.__ss_align);
  if (pVar4 == PCP_ERR_MAX_SIZE) {
    ctx_local = (pcp_ctx_t *)data.fprev;
  }
  else {
    pcp_delete_flow(data.fprev);
    ctx_local = (pcp_ctx_t *)0x0;
  }
  return (pcp_flow_t *)ctx_local;
}

Assistant:

pcp_flow_t *pcp_new_flow(pcp_ctx_t *ctx, struct sockaddr *src_addr,
                         struct sockaddr *dst_addr, struct sockaddr *ext_addr,
                         uint8_t protocol, uint32_t lifetime, void *userdata) {
    struct flow_key_data kd;
    struct caasi_data data;
    struct sockaddr_storage tmp_ext_addr;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    memset(&kd, 0, sizeof(kd));

    if ((!src_addr) || (!ctx)) {
        return NULL;
    }
    pcp_fill_in6_addr(&kd.src_ip, &kd.map_peer.src_port, &kd.scope_id,
                      src_addr);

    kd.map_peer.protocol = protocol;

    if (dst_addr) {
        switch (dst_addr->sa_family) {
        case AF_INET:
            if (((struct sockaddr_in *)(dst_addr))->sin_addr.s_addr ==
                INADDR_ANY) {
                dst_addr = NULL;
            }
            break;
        case AF_INET6:
            if (IPV6_IS_ADDR_ANY(
                    &((struct sockaddr_in6 *)(dst_addr))->sin6_addr)) {
                dst_addr = NULL;
            }
            break;
        default:
            dst_addr = NULL;
            break;
        }
    }

    if (dst_addr) {
        pcp_fill_in6_addr(&kd.map_peer.dst_ip, &kd.map_peer.dst_port, NULL,
                          dst_addr);
        kd.operation = PCP_OPCODE_PEER;
        if (src_addr->sa_family == AF_INET) {
            if (S6_ADDR32(&kd.src_ip)[3] == INADDR_ANY) {
                findsaddr((struct sockaddr_in *)dst_addr, &kd.src_ip);
            }
        } else if (IPV6_IS_ADDR_ANY(&kd.src_ip)) {
            findsaddr6((struct sockaddr_in6 *)dst_addr, &kd.src_ip,
                       &kd.scope_id);
        } else if (dst_addr->sa_family != src_addr->sa_family) {
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Socket family mismatch.");

            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return NULL;
        }
    } else {
        kd.operation = PCP_OPCODE_MAP;
    }

    if (!ext_addr) {
        struct sockaddr_in *te4 = (struct sockaddr_in *)&tmp_ext_addr;
        struct sockaddr_in6 *te6 = (struct sockaddr_in6 *)&tmp_ext_addr;
        tmp_ext_addr.ss_family = src_addr->sa_family;
        switch (tmp_ext_addr.ss_family) {
        case AF_INET:
            memset(&te4->sin_addr, 0, sizeof(te4->sin_addr));
            te4->sin_port = 0;
            break;
        case AF_INET6:
            memset(&te6->sin6_addr, 0, sizeof(te6->sin6_addr));
            te6->sin6_port = 0;
            break;
        default:
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Unsupported address family.");
            return NULL;
        }
        ext_addr = (struct sockaddr *)&tmp_ext_addr;
    }

    data.fprev = NULL;
    data.lifetime = lifetime;
    data.ext_addr = ext_addr;
    data.kd = &kd;
    data.ffirst = NULL;
    data.userdata = userdata;

    if (pcp_db_foreach_server(ctx, chain_and_assign_src_ip, &data) !=
        PCP_ERR_MAX_SIZE) { // didn't iterate through each server => error
                            // happened
        pcp_delete_flow(data.ffirst);
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return data.ffirst;
}